

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  *__r;
  int *in_RDI;
  TestMode *unaff_retaddr;
  CodecFactory **in_stack_00000008;
  int *in_stack_00000020;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *in_stack_00000030;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffe8;
  int *in_stack_fffffffffffffff0;
  
  bVar1 = AtEnd(in_stack_00000030);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x55106e);
    ParamIterator<const_libaom_test::CodecFactory_*>::operator*
              ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x551076);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x551089);
    ParamIterator<libaom_test::TestMode>::operator*
              ((ParamIterator<libaom_test::TestMode> *)0x551091);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x5510a4);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x5510ac);
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x5510bf);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x5510c7);
    std::
    get<4ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x5510da);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x5510e2);
    std::
    get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x5510f5);
    __r = (shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
           *)ParamIterator<int>::operator*((ParamIterator<int> *)0x5510fd);
    std::
    make_shared<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>,libaom_test::CodecFactory_const*const&,libaom_test::TestMode_const&,int_const&,int_const&,int_const&,int_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0,
               in_stack_ffffffffffffffe8,in_stack_00000020);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
    ::operator=(in_stack_ffffffffffffffb0,__r);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
    ::~shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                   *)0x551144);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }